

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall
OpenMD::SelectionCompiler::compileCommand
          (SelectionCompiler *this,vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *ltoken)

{
  uint uVar1;
  bool bVar2;
  
  uVar1 = ((ltoken->super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>)._M_impl.
           super__Vector_impl_data._M_start)->tok;
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator=(&this->atokenCommand,ltoken)
  ;
  if (((uVar1 >> 9 & 1) != 0) && (bVar2 = compileExpression(this), !bVar2)) {
    return false;
  }
  return true;
}

Assistant:

bool SelectionCompiler::compileCommand(const std::vector<Token>& ltoken) {
    const Token& tokenCommand = ltoken[0];
    int tokCommand            = tokenCommand.tok;

    atokenCommand = ltoken;
    if ((tokCommand & Token::expressionCommand) != 0 && !compileExpression()) {
      return false;
    }

    return true;
  }